

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obsolete_vertex_with_color.c
# Opt level: O0

void prf_obsolete_vertex_with_color_fill_vertex(prf_node_t *node,prf_vertex_t *vertex)

{
  uint *puVar1;
  node_data_conflict10 *data;
  int pos;
  bool_t complete;
  prf_vertex_t *vertex_local;
  prf_node_t *node_local;
  
  puVar1 = (uint *)node->data;
  vertex->x = (float64_t)(double)*puVar1;
  vertex->y = (float64_t)(double)puVar1[1];
  vertex->z = (float64_t)(double)puVar1[2];
  return;
}

Assistant:

void
prf_obsolete_vertex_with_color_fill_vertex(
    prf_node_t * node,
    prf_vertex_t * vertex )
{
    bool_t complete = FALSE;
    int pos = 4;

    assert( node != NULL && vertex != NULL );
    do {
        node_data * data = (node_data *) node->data;
        vertex->x = (float64_t) data->x; pos += 4;
        vertex->y = (float64_t) data->y; pos += 4;
        vertex->z = (float64_t) data->z; pos += 4;
        complete = TRUE;
    } while ( FALSE );
#if 0 /* FIXME: 990504 larsa (need docs) */
    if ( ! complete )
        prf_warn( 1, "stores only %d bytes in vertex with color", pos );
    /* padding can't be dealt with, but should be notified, though  */
    if ( pos < node->length )
        prf_warn( 2, "vertex with color is larger than %d bytes (%d)",
            pos, node->length );
#endif /* 0 - need doc */
}